

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

char * flatbuffers::EnumName<short>(short tval,TypeTable *type_table)

{
  int64_t iVar1;
  
  if (type_table == (TypeTable *)0x0) {
    return (char *)0x0;
  }
  if (((type_table->names != (char **)0x0) &&
      (iVar1 = LookupEnum((long)tval,type_table->values,type_table->num_elems), -1 < iVar1)) &&
     (iVar1 < (long)type_table->num_elems)) {
    return type_table->names[iVar1];
  }
  return (char *)0x0;
}

Assistant:

const char *EnumName(T tval, const TypeTable *type_table) {
  if (!type_table || !type_table->names) return nullptr;
  auto i = LookupEnum(static_cast<int64_t>(tval), type_table->values,
                      type_table->num_elems);
  if (i >= 0 && i < static_cast<int64_t>(type_table->num_elems)) {
    return type_table->names[i];
  }
  return nullptr;
}